

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CNegativeBufferMappedArray<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CNegativeBufferMappedArray<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLboolean GVar1;
  int i;
  GLuint GVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  CColorArray coords;
  CColorArray bufferTest;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferRef;
  DIResult result;
  allocator_type local_519;
  string local_518;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4f8;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined8 uStack_4d0;
  value_type local_4c8;
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [23];
  long local_1b8;
  DILogger local_1b0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  local_4b8._0_8_ = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,0x1b32ab9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_338,(string *)local_4b8,
                     &local_518,true);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._0_8_ != local_4a8) {
    operator_delete((void *)local_4b8._0_8_,local_4a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != local_328) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_338._1_7_,local_338[0]),local_328[0]._M_allocated_capacity + 1
                   );
  }
  if (this->_program == 0) {
    lVar7 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_518._M_dataplus._M_p = (pointer)0x0;
    local_518._M_string_length = 0;
    local_518.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_518);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_518._M_string_length - (long)local_518._M_dataplus._M_p,
               local_518._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    uStack_4d0 = 0;
    _local_4d8 = CONCAT44(1,(int)(local_518._M_string_length - (long)local_518._M_dataplus._M_p >> 4
                                 ));
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&local_4d8,0x88e4);
    local_338[0] = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
    local_1b8 = 0;
    pvVar6 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,0x10,1);
    if (pvVar6 == (void *)0x0) {
      local_1b8 = -1;
      local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4b8,
                 (char (*) [68])
                 "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL");
      DILogger::~DILogger((DILogger *)local_4b8);
    }
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar3 != 0) {
      if (GVar3 == 0x502) {
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   local_4b8,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_00,iVar5) + 4)),
                   (value_type *)&local_4f8,(allocator_type *)&local_4c8);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 4);
        lVar7 = 0;
        do {
          local_4c8.m_data[lVar7] = 1.0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_4f8,(long)(iVar4 * iVar5),&local_4c8,&local_519);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var_03,iVar4);
        iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                  (&this->super_DrawIndirectBase,0,0,iVar4,
                   *(int *)(CONCAT44(extraout_var_04,iVar5) + 4),
                   local_4f8.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        widthTest = *(uint *)CONCAT44(extraout_var_05,iVar4);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar4) + 4);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        widthRef = *(uint *)CONCAT44(extraout_var_07,iVar4);
        iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                          ((DrawIndirectBase *)this,&local_4f8,widthTest,heightTest,
                           (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_4b8,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar4) + 4));
        DIResult::sub_result(&local_1b0,(DIResult *)local_338,lVar7);
        DILogger::~DILogger(&local_1b0);
        if (local_4f8.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_4f8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4f8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_4b8._0_8_,
                          local_4a8[0]._M_allocated_capacity - local_4b8._0_8_);
        }
      }
      else {
        local_1b8 = -1;
        local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
        if (local_4b8[0] == (string)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4b8 + 8),"Invalid error code returned by a driver",0x27);
        }
        DILogger::~DILogger((DILogger *)local_4b8);
      }
    }
    if (pvVar6 != (void *)0x0) {
      GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
      if (GVar1 != '\x01') {
        local_1b8 = -1;
        local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b8 + 8));
        if (local_4b8[0] == (string)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4b8 + 8),
                     "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",
                     0x4a);
        }
        DILogger::~DILogger((DILogger *)local_4b8);
      }
    }
    lVar7 = local_1b8;
    DILogger::~DILogger((DILogger *)local_338);
    if (local_518._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_518._M_dataplus._M_p,
                      local_518.field_2._M_allocated_capacity - (long)local_518._M_dataplus._M_p);
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectArrays = { 0, 0, 0, 0 };
		indirectArrays.count					 = static_cast<GLuint>(coords.size());
		indirectArrays.primCount				 = 1;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);

		DIResult result;
		void*	buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawArraysIndirectCommand), GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";
		}

		glDrawArraysIndirect(GL_TRIANGLES, 0);

		GLenum error = glGetError();
		if (error == GL_INVALID_OPERATION)
		{
			//GL error: nothing is rendered
			CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
			CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

			ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
			result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef,
											 getWindowWidth(), getWindowHeight()));
		}
		else if (error == GL_NO_ERROR)
		{
			//No GL error: undefined
		}
		else
		{
			result.error() << "Invalid error code returned by a driver";
		}

		if (buf)
		{
			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) != GL_TRUE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;
		}

		return result.code();
	}